

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRect __thiscall
QStyleSheetStyle::subElementRect(QStyleSheetStyle *this,SubElement se,QStyleOption *opt,QWidget *w)

{
  Shape SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  Int IVar5;
  Int IVar6;
  Int IVar7;
  QStyle *pQVar8;
  QStyleOptionButton *pQVar9;
  QStyleOptionViewItem *pQVar10;
  QStyleOptionHeader *pQVar11;
  QStyleOptionProgressBar *pQVar12;
  QStyleSheetPositionData *pQVar13;
  QStyleOptionTab *pQVar14;
  QTabBar *pQVar15;
  QWidget *in_RCX;
  undefined1 auVar19 [12];
  QStyleOption *in_RDX;
  undefined8 uVar20;
  int in_ESI;
  undefined8 uVar16;
  QStyleSheetStyle *in_RDI;
  long in_FS_OFFSET;
  QRect QVar17;
  PseudoElement pe_3;
  QTabBar *bar;
  QStyleOptionTab *tab_1;
  QStyleOptionTab *tab;
  QStyleOptionProgressBar *pb;
  QStyleOptionHeader *header;
  PseudoElement pe_2;
  QStyleOptionViewItem *vopt;
  int spacing;
  bool isRadio;
  PseudoElement pe_1;
  QStyleOptionButton *btn;
  int pe;
  QRect r_3;
  QRect optRect;
  QSize sz;
  QRect arrowRect;
  QRect rect;
  QRect cr;
  QRect ir;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QRect r;
  QRenderRule subRule_8;
  QRenderRule subRule2_1;
  QFont ruleFont;
  QStyleOptionTab tabCopy;
  QRenderRule subRule_7;
  QRenderRule subRule_6;
  QRenderRule subRule_5;
  QRenderRule subRule_4;
  QRenderRule subRule_3;
  QStyleOptionViewItem optCopy;
  QRenderRule subRule2;
  QRenderRule subRule_2;
  QRenderRule subRule_1;
  QRenderRule subRule;
  QStyleOptionButton btnOpt;
  QRenderRule rule;
  undefined4 in_stack_fffffffffffff518;
  ButtonFeature in_stack_fffffffffffff51c;
  QStyleOptionViewItem *in_stack_fffffffffffff520;
  int in_stack_fffffffffffff528;
  int in_stack_fffffffffffff52c;
  QRenderRule *in_stack_fffffffffffff530;
  int in_stack_fffffffffffff538;
  int in_stack_fffffffffffff53c;
  int in_stack_fffffffffffff540;
  int in_stack_fffffffffffff544;
  undefined4 in_stack_fffffffffffff548;
  LayoutDirection in_stack_fffffffffffff54c;
  undefined4 in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  int iVar18;
  QRenderRule *in_stack_fffffffffffff558;
  QSize *size;
  LayoutDirection in_stack_fffffffffffff560;
  SubElement in_stack_fffffffffffff564;
  undefined4 in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff56c;
  LayoutDirection in_stack_fffffffffffff584;
  undefined4 in_stack_fffffffffffff588;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffff58c;
  int in_stack_fffffffffffff594;
  QRenderRule *in_stack_fffffffffffff598;
  LayoutDirection in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a4;
  QStyleSheetStyle *in_stack_fffffffffffff5a8;
  bool local_a49;
  undefined8 in_stack_fffffffffffff5e0;
  QObject *in_stack_fffffffffffff5e8;
  int local_9dc;
  int local_9cc;
  QStyleSheetStyle *opt_00;
  undefined1 in_stack_fffffffffffff658 [16];
  QFontMetrics local_998 [8];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  QRect local_970;
  QSize local_960;
  QSize local_958;
  QRect local_950;
  QRect local_940;
  QRect local_930;
  int local_920;
  undefined1 *local_91c;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_914;
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  QRect local_8f0;
  QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4> local_8e0;
  QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4> local_8dc;
  QRect local_8d8;
  undefined1 local_8c8 [16];
  QRect local_8b8;
  undefined1 local_8a8 [16];
  QRect local_898;
  QRect local_888;
  QFlagsStorageHelper<QStyleOptionButton::ButtonFeature,_4> local_878;
  QStyleSheetStyleRecursionGuard local_871;
  undefined1 local_870 [16];
  undefined1 local_860 [136];
  undefined1 local_7d8 [136];
  undefined1 *local_750;
  undefined1 *local_748;
  undefined1 local_740 [16];
  undefined8 local_730;
  undefined8 local_728;
  undefined1 local_6a0 [16];
  QRenderRule QStack_690;
  undefined1 local_590 [136];
  undefined1 local_508 [136];
  undefined1 local_480 [136];
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined1 local_328 [136];
  undefined1 local_2a0 [136];
  undefined1 local_218 [136];
  undefined1 local_190 [136];
  undefined1 local_108 [64];
  QFlags<QStyleOptionButton::ButtonFeature> aQStack_c8 [12];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  iVar18 = (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((globalStyleSheetStyle != (QStyleSheetStyle *)0x0) && (globalStyleSheetStyle != in_RDI)) {
    pQVar8 = baseStyle((QStyleSheetStyle *)
                       CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
    local_870 = (**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,in_ESI,in_RDX,in_RCX);
    goto LAB_004452a1;
  }
  local_871.guarded = true;
  opt_00 = in_RDI;
  QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(&local_871,in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,(QStyleOption *)opt_00,
             in_ESI);
  auVar3._8_8_ = local_910._8_8_;
  auVar3._0_8_ = local_910._0_8_;
  local_9cc = 0;
  switch(in_ESI) {
  case 0:
  case 1:
  case 0x38:
    pQVar9 = qstyleoption_cast<QStyleOptionButton_const*>(in_RDX);
    if (pQVar9 == (QStyleOptionButton *)0x0) goto LAB_0044523c;
    local_878.super_QFlagsStorage<QStyleOptionButton::ButtonFeature>.i =
         (QFlagsStorage<QStyleOptionButton::ButtonFeature>)
         QFlags<QStyleOptionButton::ButtonFeature>::operator&
                   ((QFlags<QStyleOptionButton::ButtonFeature> *)in_stack_fffffffffffff520,
                    in_stack_fffffffffffff51c);
    IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_878);
    local_a49 = false;
    if (IVar5 != 0) {
      local_a49 = hasStyleRule((QStyleSheetStyle *)
                               CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                               in_stack_fffffffffffff5e8,iVar18);
    }
    if (local_a49 == false) {
      bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520);
      if ((bVar4) || (bVar4 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff530), !bVar4)) {
        if (in_ESI == 0x38) {
          local_888 = QRenderRule::borderRect
                                ((QRenderRule *)
                                 CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                                 (QRect *)in_stack_fffffffffffff530);
        }
        else {
          local_888 = QRenderRule::contentsRect
                                ((QRenderRule *)
                                 CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                                 (QRect *)in_stack_fffffffffffff530);
        }
        local_870 = (undefined1  [16])
                    QStyle::visualRect(in_stack_fffffffffffff54c,
                                       (QRect *)CONCAT44(in_stack_fffffffffffff544,
                                                         in_stack_fffffffffffff540),
                                       (QRect *)CONCAT44(in_stack_fffffffffffff53c,
                                                         in_stack_fffffffffffff538));
      }
      else {
        bVar4 = QRenderRule::baseStyleCanDraw
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
        if (bVar4) {
          pQVar8 = baseStyle((QStyleSheetStyle *)
                             CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
          local_870 = (**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,in_ESI,pQVar9,in_RCX);
        }
        else {
          local_870 = (undefined1  [16])
                      QWindowsStyle::subElementRect
                                ((QWindowsStyle *)
                                 CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                                 in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558
                                 ,(QWidget *)
                                  CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
        }
      }
    }
    else {
      memset(local_108,0xaa,0x70);
      QStyleOptionButton::QStyleOptionButton
                ((QStyleOptionButton *)in_stack_fffffffffffff520,
                 (QStyleOptionButton *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)
                );
      QFlags<QStyleOptionButton::ButtonFeature>::operator&=(aQStack_c8,-3);
      bVar4 = QRenderRule::baseStyleCanDraw
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
      if (bVar4) {
        pQVar8 = baseStyle((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
        local_870 = (**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,in_ESI,local_108,in_RCX);
      }
      else {
        local_870 = (undefined1  [16])
                    QWindowsStyle::subElementRect
                              ((QWindowsStyle *)
                               CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                               in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558,
                               (QWidget *)
                               CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
      }
      QStyleOptionButton::~QStyleOptionButton((QStyleOptionButton *)in_stack_fffffffffffff520);
    }
    break;
  case 2:
  case 6:
    bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520);
    if ((!bVar4) &&
       (bVar4 = QRenderRule::hasBorder((QRenderRule *)in_stack_fffffffffffff520), !bVar4)) {
      bVar4 = hasStyleRule((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                           in_stack_fffffffffffff5e8,iVar18);
      if (!bVar4) goto LAB_0044523c;
    }
    memset(local_190,0xaa,0x88);
    renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
               (QStyleOption *)opt_00,in_ESI);
    local_870 = (undefined1  [16])
                positionRect((QStyleSheetStyle *)
                             CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                             (QWidget *)
                             CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                             in_stack_fffffffffffff558,
                             (QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                             in_stack_fffffffffffff54c,
                             (QRect *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                             in_stack_fffffffffffff5a0);
    QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
    break;
  case 3:
  case 7:
    bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520);
    if ((!bVar4) &&
       (bVar4 = QRenderRule::hasBorder((QRenderRule *)in_stack_fffffffffffff520), !bVar4)) {
      bVar4 = hasStyleRule((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                           in_stack_fffffffffffff5e8,iVar18);
      if (!bVar4) goto LAB_0044523c;
    }
    local_8a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_8a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uVar16 = 2;
    if (in_ESI == 7) {
      uVar16 = 6;
    }
    local_8a8 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle
                            + 0xc0))(in_RDI,uVar16,in_RDX,in_RCX);
    QVar17 = QStyle::visualRect(in_stack_fffffffffffff54c,
                                (QRect *)CONCAT44(in_stack_fffffffffffff544,
                                                  in_stack_fffffffffffff540),
                                (QRect *)CONCAT44(in_stack_fffffffffffff53c,
                                                  in_stack_fffffffffffff538));
    local_8b8._0_8_ = QVar17._0_8_;
    local_8a8._0_4_ = local_8b8.x1.m_i;
    local_8a8._4_4_ = local_8b8.y1.m_i;
    local_8b8._8_8_ = QVar17._8_8_;
    local_8a8._8_4_ = local_8b8.x2.m_i;
    local_8a8._12_4_ = local_8b8.y2.m_i;
    uVar16 = 0x43;
    if (in_ESI == 7) {
      uVar16 = 0x4a;
    }
    local_8b8 = QVar17;
    (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle + 0xe0))
              (in_RDI,uVar16,0,in_RCX);
    local_8c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_8c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_8c8 = (undefined1  [16])
                QRenderRule::contentsRect
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                           (QRect *)in_stack_fffffffffffff530);
    QRect::left((QRect *)0x443bf9);
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
    QRect::y((QRect *)0x443c2a);
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
    QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                   (int)((ulong)in_stack_fffffffffffff530 >> 0x20),(int)in_stack_fffffffffffff530,
                   in_stack_fffffffffffff52c,in_stack_fffffffffffff528);
    local_870 = (undefined1  [16])
                QStyle::visualRect(in_stack_fffffffffffff54c,
                                   (QRect *)CONCAT44(in_stack_fffffffffffff544,
                                                     in_stack_fffffffffffff540),
                                   (QRect *)CONCAT44(in_stack_fffffffffffff53c,
                                                     in_stack_fffffffffffff538));
    break;
  case 4:
  case 5:
    local_870 = (undefined1  [16])
                QWindowsStyle::subElementRect
                          ((QWindowsStyle *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                           in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558,
                           (QWidget *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550))
    ;
    break;
  case 8:
  case 9:
    bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520);
    if ((!bVar4) &&
       (bVar4 = QRenderRule::hasBorder((QRenderRule *)in_stack_fffffffffffff520), !bVar4)) {
      bVar4 = hasStyleRule((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                           in_stack_fffffffffffff5e8,iVar18);
      if (!bVar4) goto LAB_0044523c;
    }
    local_870 = *(undefined1 (*) [16])&in_RDX->rect;
    break;
  default:
    local_910 = auVar3;
    goto LAB_0044523c;
  case 0xc:
  case 0xd:
  case 0xe:
    pQVar12 = qstyleoption_cast<QStyleOptionProgressBar_const*>(in_RDX);
    if (pQVar12 == (QStyleOptionProgressBar *)0x0) goto LAB_0044523c;
    bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520);
    if (((!bVar4) && (bVar4 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff530), bVar4)) &&
       (bVar4 = QRenderRule::hasPosition((QRenderRule *)in_stack_fffffffffffff520), !bVar4)) {
      bVar4 = hasStyleRule((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                           in_stack_fffffffffffff5e8,iVar18);
      if (!bVar4) goto LAB_0044523c;
    }
    if (in_ESI == 0xc) {
      local_870 = (undefined1  [16])
                  QRenderRule::borderRect
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                             (QRect *)in_stack_fffffffffffff530);
    }
    else if (in_ESI == 0xd) {
      local_870 = (undefined1  [16])
                  QRenderRule::contentsRect
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                             (QRect *)in_stack_fffffffffffff530);
    }
    else {
      local_91c = &DAT_aaaaaaaaaaaaaaaa;
      local_91c = (undefined1 *)
                  QFontMetrics::size((int)pQVar12 + 0x20,(QString *)0x0,(int)pQVar12 + 0x50,
                                     (int *)0x0);
      bVar4 = QRenderRule::hasPosition((QRenderRule *)in_stack_fffffffffffff520);
      if (bVar4) {
        pQVar13 = QRenderRule::position((QRenderRule *)0x4446eb);
        size = (QSize *)&pQVar13->textAlignment;
      }
      else {
        size = (QSize *)&pQVar12->textAlignment;
      }
      local_920 = (size->wd).m_i;
      local_870 = (undefined1  [16])
                  QStyle::alignedRect(in_stack_fffffffffffff560,
                                      (Alignment)in_stack_fffffffffffff58c.i,size,
                                      (QRect *)CONCAT44(in_stack_fffffffffffff554,
                                                        in_stack_fffffffffffff550));
    }
    break;
  case 0xf:
    if (in_RCX != (QWidget *)0x0) {
      QWidget::parentWidget((QWidget *)0x443ced);
      bVar4 = hasStyleRule((QStyleSheetStyle *)
                           CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                           in_stack_fffffffffffff5e8,iVar18);
      if (bVar4) {
        memset(local_218,0xaa,0x88);
        QWidget::parentWidget((QWidget *)0x443d2f);
        renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
                   (QStyleOption *)opt_00,in_ESI);
        local_8d8 = QRenderRule::contentsRect
                              ((QRenderRule *)
                               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                               (QRect *)in_stack_fffffffffffff530);
        local_870 = (undefined1  [16])
                    QStyle::visualRect(in_stack_fffffffffffff54c,
                                       (QRect *)CONCAT44(in_stack_fffffffffffff544,
                                                         in_stack_fffffffffffff540),
                                       (QRect *)CONCAT44(in_stack_fffffffffffff53c,
                                                         in_stack_fffffffffffff538));
        QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
        break;
      }
    }
    goto LAB_0044523c;
  case 0x10:
    memset(local_508,0xaa,0x88);
    renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
               (QStyleOption *)opt_00,in_ESI);
    bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520);
    if (bVar4) {
LAB_004443cf:
      local_870._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_870._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_870 = (undefined1  [16])
                  QRenderRule::contentsRect
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                             (QRect *)in_stack_fffffffffffff530);
      pQVar11 = qstyleoption_cast<QStyleOptionHeader_const*>(in_RDX);
      auVar2._8_8_ = local_910._8_8_;
      auVar2._0_8_ = local_910._0_8_;
      if ((pQVar11 != (QStyleOptionHeader *)0x0) &&
         (local_910 = auVar2, pQVar11->sortIndicator != None)) {
        local_910._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_910._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_910 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.
                                           super_QStyle + 0xc0))(in_RDI,0x11,in_RDX,in_RCX);
        bVar4 = QRect::isValid((QRect *)in_stack_fffffffffffff520);
        if (bVar4) {
          local_914.super_QFlagsStorage<QStyle::StateFlag>.i =
               (QFlagsStorage<QStyle::StateFlag>)
               QFlags<QStyle::StateFlag>::operator&
                         ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffff520,
                          in_stack_fffffffffffff51c);
          IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_914);
          if (IVar7 == 0) {
            QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
            QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
            QRect::setHeight((QRect *)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
          }
          else {
            QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
            QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
            QRect::setWidth((QRect *)in_stack_fffffffffffff520,in_stack_fffffffffffff51c);
          }
        }
      }
      bVar4 = true;
    }
    else {
      bVar4 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff530);
      if (!bVar4) goto LAB_004443cf;
      bVar4 = false;
    }
    QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
    goto joined_r0x0044435a;
  case 0x11:
    memset(local_480,0xaa,0x88);
    renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
               (QStyleOption *)opt_00,in_ESI);
    bVar4 = QRenderRule::hasPosition((QRenderRule *)in_stack_fffffffffffff520);
    if ((bVar4) ||
       (bVar4 = QRenderRule::hasGeometry((QRenderRule *)in_stack_fffffffffffff520), bVar4)) {
      local_870 = (undefined1  [16])
                  positionRect((QStyleSheetStyle *)
                               CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                               (QWidget *)
                               CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                               in_stack_fffffffffffff558,
                               (QRenderRule *)
                               CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                               in_stack_fffffffffffff54c,
                               (QRect *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540
                                                ),in_stack_fffffffffffff5a0);
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
joined_r0x0044435a:
    if (!bVar4) goto LAB_0044523c;
    break;
  case 0x12:
    goto switchD_0044358b_caseD_12;
  case 0x13:
  case 0x14:
    goto switchD_0044358b_caseD_13;
  case 0x15:
    local_9cc = 0x38;
  case 0x16:
    if (local_9cc == 0) {
      local_9cc = 0x39;
    }
    goto switchD_0044358b_caseD_12;
  case 0x17:
    pQVar10 = qstyleoption_cast<QStyleOptionViewItem_const*>(in_RDX);
    if (pQVar10 != (QStyleOptionViewItem *)0x0) goto switchD_0044358b_caseD_2d;
    local_870 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle
                            + 0xc0))(in_RDI,2,in_RDX,in_RCX);
    break;
  case 0x18:
    memset(&QStack_690.clipset,0xaa,0x88);
    renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
               (QStyleOption *)opt_00,in_ESI);
    bVar4 = QRenderRule::hasContentsSize((QRenderRule *)in_stack_fffffffffffff520);
    if (bVar4) {
      local_870._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_870._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect((QRect *)in_stack_fffffffffffff520);
      pQVar14 = qstyleoption_cast<QStyleOptionTab_const*>(in_RDX);
      if (pQVar14 != (QStyleOptionTab *)0x0) {
        SVar1 = pQVar14->shape;
        if (SVar1 < RoundedWest) {
LAB_00444b0b:
          in_stack_fffffffffffff544 = QRect::left((QRect *)0x444b1c);
          QRect::top((QRect *)0x444b31);
          local_958 = QRenderRule::size((QRenderRule *)
                                        CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528
                                                ));
          in_stack_fffffffffffff54c = QSize::width((QSize *)0x444b57);
          QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
          QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                         (int)((ulong)in_stack_fffffffffffff530 >> 0x20),
                         (int)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                         in_stack_fffffffffffff528);
        }
        else if (SVar1 - RoundedWest < 2) {
LAB_00444b8d:
          in_stack_fffffffffffff538 = QRect::left((QRect *)0x444b9e);
          in_stack_fffffffffffff53c = QRect::top((QRect *)0x444bb3);
          in_stack_fffffffffffff540 =
               QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
          local_960 = QRenderRule::size((QRenderRule *)
                                        CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528
                                                ));
          QSize::height((QSize *)0x444bee);
          QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                         (int)((ulong)in_stack_fffffffffffff530 >> 0x20),
                         (int)in_stack_fffffffffffff530,in_stack_fffffffffffff52c,
                         in_stack_fffffffffffff528);
        }
        else {
          if (SVar1 - TriangularNorth < 2) goto LAB_00444b0b;
          if (SVar1 - TriangularWest < 2) goto LAB_00444b8d;
        }
        local_970 = QStyle::visualRect(in_stack_fffffffffffff54c,
                                       (QRect *)CONCAT44(in_stack_fffffffffffff544,
                                                         in_stack_fffffffffffff540),
                                       (QRect *)CONCAT44(in_stack_fffffffffffff53c,
                                                         in_stack_fffffffffffff538));
        local_870 = (undefined1  [16])local_970;
      }
      local_9dc = 1;
    }
    else {
      local_9dc = 2;
    }
    QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
    goto joined_r0x00445033;
  case 0x1a:
  case 0x1b:
  case 0x33:
    bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520);
    if (!bVar4) {
      bVar4 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff530);
      if (bVar4) goto LAB_0044523c;
    }
    local_898 = QRenderRule::contentsRect
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                           (QRect *)in_stack_fffffffffffff530);
    local_870 = (undefined1  [16])
                QStyle::visualRect(in_stack_fffffffffffff54c,
                                   (QRect *)CONCAT44(in_stack_fffffffffffff544,
                                                     in_stack_fffffffffffff540),
                                   (QRect *)CONCAT44(in_stack_fffffffffffff53c,
                                                     in_stack_fffffffffffff538));
    break;
  case 0x1c:
  case 0x1d:
    memset(local_7d8,0xaa,0x88);
    renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
               (QStyleOption *)opt_00,in_ESI);
    bVar4 = QRenderRule::hasPosition((QRenderRule *)in_stack_fffffffffffff520);
    if (bVar4) {
      memset(local_860,0xaa,0x88);
      renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
                 (QStyleOption *)opt_00,in_ESI);
      local_870 = (undefined1  [16])
                  positionRect((QStyleSheetStyle *)
                               CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                               (QWidget *)
                               CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                               in_stack_fffffffffffff558,
                               (QRenderRule *)
                               CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                               in_stack_fffffffffffff54c,
                               (QRect *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540
                                                ),in_stack_fffffffffffff5a0);
      local_9dc = 1;
      QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
    }
    else {
      local_9dc = 2;
    }
    QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
    goto joined_r0x00445033;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
    bVar4 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff530);
    if (bVar4) goto LAB_0044523c;
    local_870 = *(undefined1 (*) [16])&in_RDX->rect;
    break;
  case 0x2d:
  case 0x2e:
  case 0x2f:
switchD_0044358b_caseD_2d:
    pQVar10 = qstyleoption_cast<QStyleOptionViewItem_const*>(in_RDX);
    if (pQVar10 != (QStyleOptionViewItem *)0x0) {
      memset(local_2a0,0xaa,0x88);
      renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
                 (QStyleOption *)opt_00,in_ESI);
      if ((in_ESI == 0x2e) || (in_ESI == 0x2f)) {
LAB_0044405b:
        bVar4 = QRenderRule::hasGeometry((QRenderRule *)in_stack_fffffffffffff520);
        if ((((bVar4) ||
             (bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520), bVar4)) ||
            (bVar4 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff530), !bVar4)) ||
           (bVar4 = hasStyleRule((QStyleSheetStyle *)
                                 CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                                 in_stack_fffffffffffff5e8,iVar18), bVar4)) {
          memset(local_328,0xaa,0x88);
          renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
                     (QStyleOption *)opt_00,in_ESI);
          memset(local_3f8,0xaa,0xd0);
          QStyleOptionViewItem::QStyleOptionViewItem
                    (in_stack_fffffffffffff520,
                     (QStyleOptionViewItem *)
                     CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
          QVar17 = QRenderRule::contentsRect
                             ((QRenderRule *)
                              CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                              (QRect *)in_stack_fffffffffffff530);
          local_8f0._0_8_ = QVar17._0_8_;
          local_3e8._0_4_ = local_8f0.x1.m_i;
          local_3e8._4_4_ = local_8f0.y1.m_i;
          local_8f0._8_8_ = QVar17._8_8_;
          local_3e0._0_4_ = local_8f0.x2.m_i;
          local_3e0._4_4_ = local_8f0.y2.m_i;
          local_900._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_900._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_8f0 = QVar17;
          local_900 = (undefined1  [16])
                      QWindowsStyle::subElementRect
                                ((QWindowsStyle *)
                                 CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                                 in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558
                                 ,(QWidget *)
                                  CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
          local_870 = (undefined1  [16])
                      positionRect(in_stack_fffffffffffff5a8,
                                   (QWidget *)
                                   CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
                                   in_stack_fffffffffffff598,in_stack_fffffffffffff594,
                                   (QRect *)CONCAT44(in_stack_fffffffffffff58c.i,
                                                     in_stack_fffffffffffff588),
                                   in_stack_fffffffffffff584);
          local_9dc = 1;
          QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffff520);
          QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
        }
        else {
          local_9dc = 0;
        }
      }
      else {
        bVar4 = false;
        if (in_ESI == 0x2d) {
          local_8dc.super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
               (QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>)
               QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&
                         ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)in_stack_fffffffffffff520
                          ,in_stack_fffffffffffff51c);
          IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8dc);
          bVar4 = IVar6 != 0;
        }
        if (bVar4) goto LAB_0044405b;
        bVar4 = false;
        if (in_ESI == 0x17) {
          local_8e0.super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
               (QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>)
               QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&
                         ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)in_stack_fffffffffffff520
                          ,in_stack_fffffffffffff51c);
          IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8e0);
          bVar4 = IVar6 != 0;
        }
        if (bVar4) goto LAB_0044405b;
        local_9dc = 2;
      }
      QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
      if ((local_9dc != 0) && (local_9dc != 2)) break;
    }
LAB_0044523c:
    pQVar8 = baseStyle((QStyleSheetStyle *)
                       CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
    local_870 = (**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,in_ESI,in_RDX,in_RCX);
    break;
  case 0x30:
  case 0x31:
  case 0x32:
    memset(local_6a0,0xaa,0x88);
    renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,
               (QStyleOption *)opt_00,in_ESI);
    bVar4 = QRenderRule::hasBox((QRenderRule *)in_stack_fffffffffffff520);
    if (((bVar4) || (bVar4 = QRenderRule::hasNativeBorder(in_stack_fffffffffffff530), !bVar4)) ||
       (((byte)QStack_690.font & 1) != 0)) {
      if ((in_ESI == 0x32) &&
         (pQVar14 = qstyleoption_cast<QStyleOptionTab_const*>(in_RDX),
         pQVar14 != (QStyleOptionTab *)0x0)) {
        pQVar15 = qobject_cast<QTabBar_const*>((QObject *)0x444d4f);
        local_980._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_980._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        if ((pQVar15 == (QTabBar *)0x0) || (pQVar14->tabIndex == -1)) {
          local_980 = *(undefined1 (*) [16])&in_RDX->rect;
        }
        else {
          local_980 = (undefined1  [16])
                      QTabBar::tabRect((QTabBar *)
                                       CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548)
                                       ,in_stack_fffffffffffff544);
        }
        local_990._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_990._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_990 = (undefined1  [16])
                    positionRect(in_stack_fffffffffffff5a8,
                                 (QWidget *)
                                 CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
                                 in_stack_fffffffffffff598,in_stack_fffffffffffff594,
                                 (QRect *)CONCAT44(in_stack_fffffffffffff58c.i,
                                                   in_stack_fffffffffffff588),
                                 in_stack_fffffffffffff584);
        memset(local_740,0xaa,0xa0);
        QStyleOptionTab::QStyleOptionTab
                  ((QStyleOptionTab *)in_stack_fffffffffffff520,
                   (QStyleOptionTab *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518))
        ;
        if (((byte)QStack_690.font & 1) != 0) {
          local_750 = &DAT_aaaaaaaaaaaaaaaa;
          local_748 = &DAT_aaaaaaaaaaaaaaaa;
          if (in_RCX == (QWidget *)0x0) {
            QFont::QFont((QFont *)&local_750,(QFont *)&QStack_690);
          }
          else {
            in_stack_fffffffffffff530 = &QStack_690;
            QWidget::font(in_RCX);
            QFont::resolve((QFont *)&local_750);
          }
          QFontMetrics::QFontMetrics(local_998,(QFont *)&local_750);
          QFontMetrics::operator=
                    ((QFontMetrics *)in_stack_fffffffffffff520,
                     (QFontMetrics *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
          QFontMetrics::~QFontMetrics(local_998);
          QFont::~QFont((QFont *)&local_750);
        }
        QVar17 = QRenderRule::contentsRect
                           ((QRenderRule *)
                            CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                            (QRect *)in_stack_fffffffffffff530);
        local_730 = QVar17._0_8_;
        local_728 = QVar17._8_8_;
        local_870 = (undefined1  [16])
                    QWindowsStyle::subElementRect
                              ((QWindowsStyle *)
                               CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                               in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558,
                               (QWidget *)
                               CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
        local_9dc = 1;
        QStyleOptionTab::~QStyleOptionTab((QStyleOptionTab *)in_stack_fffffffffffff520);
      }
      else {
        local_870 = (undefined1  [16])
                    QWindowsStyle::subElementRect
                              ((QWindowsStyle *)
                               CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                               in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558,
                               (QWidget *)
                               CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
        local_9dc = 1;
      }
    }
    else {
      local_9dc = 2;
    }
    QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
joined_r0x00445033:
    if (local_9dc == 2) goto LAB_0044523c;
    break;
  case 0x34:
    bVar4 = hasStyleRule((QStyleSheetStyle *)
                         CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                         in_stack_fffffffffffff5e8,iVar18);
    if (!bVar4) goto LAB_0044523c;
    local_870 = (undefined1  [16])
                QWindowsStyle::subElementRect
                          ((QWindowsStyle *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                           in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558,
                           (QWidget *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550))
    ;
    break;
  case 0x35:
  case 0x36:
    bVar4 = hasStyleRule((QStyleSheetStyle *)
                         CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                         in_stack_fffffffffffff5e8,iVar18);
    if (!bVar4) goto LAB_0044523c;
    local_870 = (undefined1  [16])
                QWindowsStyle::subElementRect
                          ((QWindowsStyle *)
                           CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                           in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558,
                           (QWidget *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550))
    ;
  }
LAB_00445287:
  QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
  QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(&local_871);
LAB_004452a1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar17.x1.m_i = local_870._0_4_;
    auVar19._4_4_ = local_870._4_4_;
    register0x00000010 = local_870._8_4_;
    register0x00000014 = local_870._12_4_;
    return QVar17;
  }
  __stack_chk_fail();
switchD_0044358b_caseD_12:
  if (local_9cc == 0) {
    local_9cc = 0x37;
  }
switchD_0044358b_caseD_13:
  if (local_9cc == 0) {
    local_9cc = 0x36;
  }
  bVar4 = hasStyleRule((QStyleSheetStyle *)
                       CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                       in_stack_fffffffffffff5e8,iVar18);
  if (!bVar4) goto LAB_0044523c;
  local_870._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_870._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iVar18 = in_ESI;
  if (local_9cc == 0x36) {
    iVar18 = 0x13;
  }
  local_870 = (undefined1  [16])
              QWindowsStyle::subElementRect
                        ((QWindowsStyle *)
                         CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                         in_stack_fffffffffffff564,(QStyleOption *)in_stack_fffffffffffff558,
                         (QWidget *)CONCAT44(iVar18,in_stack_fffffffffffff550));
  memset(local_590,0xaa,0x88);
  renderRule(in_stack_fffffffffffff658._8_8_,in_stack_fffffffffffff658._0_8_,(QStyleOption *)opt_00,
             in_ESI);
  local_930 = positionRect(in_stack_fffffffffffff5a8,
                           (QWidget *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
                           in_stack_fffffffffffff598,in_stack_fffffffffffff594,
                           (QRect *)CONCAT44(in_stack_fffffffffffff58c.i,in_stack_fffffffffffff588),
                           in_stack_fffffffffffff584);
  local_870 = (undefined1  [16])local_930;
  if (local_9cc == 0x37) {
    local_940 = QRect::intersected((QRect *)in_stack_fffffffffffff520,
                                   (QRect *)CONCAT44(in_stack_fffffffffffff51c,
                                                     in_stack_fffffffffffff518));
    local_870 = (undefined1  [16])local_940;
  }
  if (in_ESI == 0x14) {
    local_950 = QRenderRule::contentsRect
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                           (QRect *)in_stack_fffffffffffff530);
    local_870 = (undefined1  [16])local_950;
  }
  QRenderRule::~QRenderRule((QRenderRule *)in_stack_fffffffffffff520);
  goto LAB_00445287;
}

Assistant:

QRect QStyleSheetStyle::subElementRect(SubElement se, const QStyleOption *opt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->subElementRect(se, opt, w))

    QRenderRule rule = renderRule(w, opt);
#if QT_CONFIG(tabbar)
    int pe = PseudoElement_None;
#endif

    switch (se) {
    case SE_PushButtonContents:
    case SE_PushButtonBevel:
    case SE_PushButtonFocusRect:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (btn->features & QStyleOptionButton::HasMenu
                && hasStyleRule(w, PseudoElement_PushButtonMenuIndicator)) {
                QStyleOptionButton btnOpt(*btn);
                btnOpt.features &= ~QStyleOptionButton::HasMenu;
                return rule.baseStyleCanDraw() ? baseStyle()->subElementRect(se, &btnOpt, w)
                                               : QWindowsStyle::subElementRect(se, &btnOpt, w);
            }
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                return visualRect(opt->direction, opt->rect, se == SE_PushButtonBevel
                                                                ? rule.borderRect(opt->rect)
                                                                : rule.contentsRect(opt->rect));
            }
            return rule.baseStyleCanDraw() ? baseStyle()->subElementRect(se, btn, w)
                                           : QWindowsStyle::subElementRect(se, btn, w);
        }
        break;

    case SE_LineEditContents:
    case SE_FrameContents:
    case SE_ShapedFrameContents:
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            return visualRect(opt->direction, opt->rect, rule.contentsRect(opt->rect));
        }
        break;

    case SE_CheckBoxIndicator:
    case SE_RadioButtonIndicator:
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            PseudoElement pe = se == SE_CheckBoxIndicator ? PseudoElement_Indicator : PseudoElement_ExclusiveIndicator;
            QRenderRule subRule = renderRule(w, opt, pe);
            return positionRect(w, rule, subRule, pe, opt->rect, opt->direction);
        }
        break;

    case SE_CheckBoxContents:
    case SE_RadioButtonContents:
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            bool isRadio = se == SE_RadioButtonContents;
            QRect ir = subElementRect(isRadio ? SE_RadioButtonIndicator : SE_CheckBoxIndicator,
                                      opt, w);
            ir = visualRect(opt->direction, opt->rect, ir);
            int spacing = pixelMetric(isRadio ? PM_RadioButtonLabelSpacing : PM_CheckBoxLabelSpacing, nullptr, w);
            QRect cr = rule.contentsRect(opt->rect);
            ir.setRect(ir.left() + ir.width() + spacing, cr.y(),
                       cr.width() - ir.width() - spacing, cr.height());
            return visualRect(opt->direction, opt->rect, ir);
        }
        break;

    case SE_ToolBoxTabContents:
        if (w && hasStyleRule(w->parentWidget(), PseudoElement_ToolBoxTab)) {
            QRenderRule subRule = renderRule(w->parentWidget(), opt, PseudoElement_ToolBoxTab);
            return visualRect(opt->direction, opt->rect, subRule.contentsRect(opt->rect));
        }
        break;

    case SE_RadioButtonFocusRect:
    case SE_RadioButtonClickRect: // focusrect | indicator
        if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
            return opt->rect;
        }
        break;

    case SE_CheckBoxFocusRect:
    case SE_CheckBoxClickRect: // relies on indicator and contents
        return ParentStyle::subElementRect(se, opt, w);

#if QT_CONFIG(itemviews)
    case SE_ItemViewItemCheckIndicator:
        if (!qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            return subElementRect(SE_CheckBoxIndicator, opt, w);
        }
        Q_FALLTHROUGH();
    case SE_ItemViewItemText:
    case SE_ItemViewItemDecoration:
    case SE_ItemViewItemFocusRect:
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_ViewItem);
            PseudoElement pe = PseudoElement_None;
            if (se == SE_ItemViewItemText || se == SE_ItemViewItemFocusRect)
                pe = PseudoElement_ViewItemText;
            else if (se == SE_ItemViewItemDecoration && vopt->features & QStyleOptionViewItem::HasDecoration)
                pe = PseudoElement_ViewItemIcon;
            else if (se == SE_ItemViewItemCheckIndicator && vopt->features & QStyleOptionViewItem::HasCheckIndicator)
                pe = PseudoElement_ViewItemIndicator;
            else
                break;
            if (subRule.hasGeometry() || subRule.hasBox() || !subRule.hasNativeBorder() || hasStyleRule(w, pe)) {
                QRenderRule subRule2 = renderRule(w, opt, pe);
                QStyleOptionViewItem optCopy(*vopt);
                optCopy.rect = subRule.contentsRect(vopt->rect);
                QRect rect = ParentStyle::subElementRect(se, &optCopy, w);
                return positionRect(w, subRule2, pe, rect, opt->direction);
            }
         }
        break;
#endif // QT_CONFIG(itemviews)

    case SE_HeaderArrow: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewUpArrow);
        if (subRule.hasPosition() || subRule.hasGeometry())
            return positionRect(w, rule, subRule, PseudoElement_HeaderViewUpArrow, opt->rect, opt->direction);
                         }
        break;

    case SE_HeaderLabel: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewSection);
        if (subRule.hasBox() || !subRule.hasNativeBorder()) {
            auto r = subRule.contentsRect(opt->rect);
            if (const QStyleOptionHeader *header = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
                // Subtract width needed for arrow, if there is one
                if (header->sortIndicator != QStyleOptionHeader::None) {
                    const auto arrowRect = subElementRect(SE_HeaderArrow, opt, w);
                    if (arrowRect.isValid()) {
                        if (opt->state & State_Horizontal)
                            r.setWidth(r.width() - arrowRect.width());
                        else
                            r.setHeight(r.height() - arrowRect.height());
                    }
                }
            }
            return r;
        }
                         }
        break;

    case SE_ProgressBarGroove:
    case SE_ProgressBarContents:
    case SE_ProgressBarLabel:
        if (const QStyleOptionProgressBar *pb = qstyleoption_cast<const QStyleOptionProgressBar *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder() || rule.hasPosition() || hasStyleRule(w, PseudoElement_ProgressBarChunk)) {
                if (se == SE_ProgressBarGroove)
                    return rule.borderRect(pb->rect);
                else if (se == SE_ProgressBarContents)
                    return rule.contentsRect(pb->rect);

                QSize sz = pb->fontMetrics.size(0, pb->text);
                return QStyle::alignedRect(Qt::LeftToRight, rule.hasPosition() ? rule.position()->textAlignment : pb->textAlignment,
                                           sz, pb->rect);
            }
        }
        break;

#if QT_CONFIG(tabbar)
    case SE_TabWidgetLeftCorner:
        pe = PseudoElement_TabWidgetLeftCorner;
        Q_FALLTHROUGH();
    case SE_TabWidgetRightCorner:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetRightCorner;
        Q_FALLTHROUGH();
    case SE_TabWidgetTabBar:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetTabBar;
        Q_FALLTHROUGH();
    case SE_TabWidgetTabPane:
    case SE_TabWidgetTabContents:
        if (pe == PseudoElement_None)
            pe = PseudoElement_TabWidgetPane;

        if (hasStyleRule(w, pe)) {
            QRect r = QWindowsStyle::subElementRect(pe == PseudoElement_TabWidgetPane ? SE_TabWidgetTabPane : se, opt, w);
            QRenderRule subRule = renderRule(w, opt, pe);
            r = positionRect(w, subRule, pe, r, opt->direction);
            if (pe == PseudoElement_TabWidgetTabBar) {
                Q_ASSERT(opt);
                r = opt->rect.intersected(r);
            }
            if (se == SE_TabWidgetTabContents)
                r = subRule.contentsRect(r);
            return r;
        }
        break;

    case SE_TabBarScrollLeftButton:
    case SE_TabBarScrollRightButton:
        if (hasStyleRule(w, PseudoElement_TabBarScroller))
            return ParentStyle::subElementRect(se, opt, w);
        break;

    case SE_TabBarTearIndicator: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTear);
        if (subRule.hasContentsSize()) {
            QRect r;
            if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                switch (tab->shape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    r.setRect(tab->rect.left(), tab->rect.top(), subRule.size().width(), opt->rect.height());
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    r.setRect(tab->rect.left(), tab->rect.top(), opt->rect.width(), subRule.size().height());
                    break;
                default:
                    break;
                }
                r = visualRect(opt->direction, opt->rect, r);
            }
            return r;
        }
        break;
    }
    case SE_TabBarTabText:
    case SE_TabBarTabLeftButton:
    case SE_TabBarTabRightButton: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
            if (se == SE_TabBarTabText) {
                if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                    const QTabBar *bar = qobject_cast<const QTabBar *>(w);
                    const QRect optRect = bar && tab->tabIndex != -1 ? bar->tabRect(tab->tabIndex) : opt->rect;
                    const QRect r = positionRect(w, subRule, PseudoElement_TabBarTab, optRect, opt->direction);
                    QStyleOptionTab tabCopy(*tab);
                    if (subRule.hasFont) {
                        const QFont ruleFont = w ? subRule.font.resolve(w->font()) : subRule.font;
                        tabCopy.fontMetrics = QFontMetrics(ruleFont);
                    }
                    tabCopy.rect = subRule.contentsRect(r);
                    return ParentStyle::subElementRect(se, &tabCopy, w);
                }
            }
            return ParentStyle::subElementRect(se, opt, w);
        }
        break;
    }
#endif // QT_CONFIG(tabbar)

    case SE_DockWidgetCloseButton:
    case SE_DockWidgetFloatButton: {
        PseudoElement pe = (se == SE_DockWidgetCloseButton) ? PseudoElement_DockWidgetCloseButton : PseudoElement_DockWidgetFloatButton;
        QRenderRule subRule2 = renderRule(w, opt, pe);
        if (!subRule2.hasPosition())
            break;
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetTitle);
        return positionRect(w, subRule, subRule2, pe, opt->rect, opt->direction);
                                   }

#if QT_CONFIG(toolbar)
    case SE_ToolBarHandle:
        if (hasStyleRule(w, PseudoElement_ToolBarHandle))
            return ParentStyle::subElementRect(se, opt, w);
        break;
#endif // QT_CONFIG(toolbar)

    // On mac we make pixel adjustments to layouts which are not
    // desirable when you have custom style sheets on them
    case SE_CheckBoxLayoutItem:
    case SE_ComboBoxLayoutItem:
    case SE_DateTimeEditLayoutItem:
    case SE_LabelLayoutItem:
    case SE_ProgressBarLayoutItem:
    case SE_PushButtonLayoutItem:
    case SE_RadioButtonLayoutItem:
    case SE_SliderLayoutItem:
    case SE_SpinBoxLayoutItem:
    case SE_ToolButtonLayoutItem:
    case SE_FrameLayoutItem:
    case SE_GroupBoxLayoutItem:
    case SE_TabWidgetLayoutItem:
        if (!rule.hasNativeBorder())
            return opt->rect;
        break;

    default:
        break;
    }

    return baseStyle()->subElementRect(se, opt, w);
}